

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O2

void avro::codec_traits<umu::_union_map_union_Union__0__>::encode
               (Encoder *e,_union_map_union_Union__0__ *v)

{
  string sStack_38;
  
  (**(code **)(*(long *)e + 0xa0))(e,v->idx_);
  if (v->idx_ != 1) {
    if (v->idx_ == 0) {
      umu::_union_map_union_Union__0__::get_string_abi_cxx11_(&sStack_38,v);
      (**(code **)(*(long *)e + 0x50))(e,&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
    return;
  }
  (**(code **)(*(long *)e + 0x20))(e);
  return;
}

Assistant:

static void encode(Encoder& e, umu::_union_map_union_Union__0__ v) {
        e.encodeUnionIndex(v.idx());
        switch (v.idx()) {
        case 0:
            avro::encode(e, v.get_string());
            break;
        case 1:
            e.encodeNull();
            break;
        }
    }